

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_WriteString(BCWriterState *s,JSString *p)

{
  int iVar1;
  BCWriterState *in_RSI;
  DynBuf *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined2 in_stack_ffffffffffffffee;
  
  bc_put_leb128(in_RSI,CONCAT22(in_stack_ffffffffffffffee,in_stack_ffffffffffffffec));
  if ((*(ulong *)((long)&in_RSI->ctx + 4) >> 0x1f & 1) == 0) {
    dbuf_put(in_RDI,(uint8_t *)in_RSI,
             CONCAT26(in_stack_ffffffffffffffee,
                      CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)));
  }
  else {
    for (iVar1 = 0; iVar1 < (int)((uint)*(undefined8 *)((long)&in_RSI->ctx + 4) & 0x7fffffff);
        iVar1 = iVar1 + 1) {
      bc_put_u16(in_RSI,(uint16_t)((uint)iVar1 >> 0x10));
    }
  }
  return;
}

Assistant:

static void JS_WriteString(BCWriterState *s, JSString *p)
{
    int i;
    bc_put_leb128(s, ((uint32_t)p->len << 1) | p->is_wide_char);
    if (p->is_wide_char) {
        for(i = 0; i < p->len; i++)
            bc_put_u16(s, p->u.str16[i]);
    } else {
        dbuf_put(&s->dbuf, p->u.str8, p->len);
    }
}